

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O3

bool Js::JavascriptStackWalker::ValidateTopJitFrame(ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  InterpreterStackFrame *pIVar5;
  undefined1 local_e0 [8];
  JavascriptStackWalker walker;
  JavascriptFunction *function;
  
  if (DAT_015932ce == '\x01') {
    JavascriptStackWalker((JavascriptStackWalker *)local_e0,scriptContext,true,(PVOID)0x0,false);
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      BVar3 = GetCaller((JavascriptStackWalker *)local_e0,
                        (JavascriptFunction **)&walker.currentFrame.stackCheckCodeHeight,true);
      if (BVar3 == 0) break;
      if (walker.currentFrame.stackCheckCodeHeight == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                    ,0x641,"(function)","function");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      pIVar5 = GetCurrentInterpreterFrame((JavascriptStackWalker *)local_e0);
    } while (pIVar5 == (InterpreterStackFrame *)0x0);
    ~JavascriptStackWalker((JavascriptStackWalker *)local_e0);
  }
  return true;
}

Assistant:

bool JavascriptStackWalker::ValidateTopJitFrame(Js::ScriptContext* scriptContext)
    {
        if (!Configuration::Global.flags.ValidateInlineStack)
        {
            return true;
        }
        Js::JavascriptStackWalker walker(scriptContext);
        Js::JavascriptFunction* function;
        while (walker.GetCaller(&function))
        {
            Assert(function);
            if (walker.GetCurrentInterpreterFrame() != nullptr)
            {
                break;
            }
        }
        // If no asserts have fired yet - we should have succeeded.
        return true;
    }